

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpChildrenBinary(Node *this,StreamWriterLE *s)

{
  pointer pNVar1;
  Node *child;
  pointer this_00;
  
  pNVar1 = (this->children).
           super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->children).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1) {
    DumpBinary(this_00,s);
  }
  return;
}

Assistant:

void FBX::Node::DumpChildrenBinary(Assimp::StreamWriterLE& s)
{
    for (FBX::Node& child : children) {
        child.DumpBinary(s);
    }
}